

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_new_proc(Am_Object *param_1)

{
  Am_Gesture_Trainer local_18 [8];
  Am_Object *local_10;
  Am_Object *param_0_local;
  
  local_10 = param_1;
  Am_Gesture_Trainer::Am_Gesture_Trainer(local_18);
  Am_Gesture_Trainer::operator=((Am_Gesture_Trainer *)&trainer,local_18);
  Am_Gesture_Trainer::~Am_Gesture_Trainer(local_18);
  Am_String::operator=(&current_filename,"");
  save_with_examples = true;
  Am_Object::Set(0x5510,0xa2,0);
  Am_Object::Set(0x5510,0x169,0);
  Am_Object::Set(0x5560,(Am_String *)0x169,0x115570);
  dirty = false;
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_new, (Am_Object /*cmd*/))
{
  trainer = Am_Gesture_Trainer();

  current_filename = "";
  save_with_examples = true;

  class_panel.Set(Am_ITEMS, 0);
  class_panel.Set(Am_VALUE, 0);

  mode.Set(Am_VALUE, training_mode);

  dirty = false;
}